

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Refal2.cpp
# Opt level: O0

bool Refal2::CompareNoCase(string *str1,string *str2)

{
  char a;
  bool bVar1;
  long lVar2;
  long lVar3;
  reference pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator j;
  const_iterator i;
  string *str2_local;
  string *str1_local;
  
  lVar2 = std::__cxx11::string::length();
  lVar3 = std::__cxx11::string::length();
  if (lVar2 == lVar3) {
    j._M_current = (char *)std::__cxx11::string::begin();
    local_30._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      local_38._M_current = (char *)std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=(&j,&local_38);
      if (!bVar1) break;
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&j);
      a = *pcVar4;
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_30);
      bVar1 = CompareNoCase(a,*pcVar4);
      if (!bVar1) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&j);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_30);
    }
    local_40._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator==(&local_30,&local_40);
    if (!bVar1) {
      __assert_fail("j == str2.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Refal2.cpp"
                    ,0x1c,"bool Refal2::CompareNoCase(const std::string &, const std::string &)");
    }
    str1_local._7_1_ = true;
  }
  else {
    str1_local._7_1_ = false;
  }
  return str1_local._7_1_;
}

Assistant:

bool CompareNoCase( const std::string& str1, const std::string& str2 )
{
	if( str1.length() != str2.length() ) {
		return false;
	}
	std::string::const_iterator i = str1.begin();
	std::string::const_iterator j = str2.begin();
	for( ; i != str1.end(); ++i, ++j ) {
		if( !CompareNoCase( *i, *j ) ) {
			return false;
		}
	}
	assert( j == str2.end() );
	return true;
}